

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::z_formatter::format(z_formatter *this,log_msg *msg,tm *tm_time,memory_buffer *dest)

{
  ulong uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  scoped_pad p;
  scoped_pad local_40;
  
  scoped_pad::scoped_pad(&local_40,6,&(this->super_flag_formatter).padinfo_,dest);
  auVar3 = SEXT816(tm_time->tm_gmtoff) * ZEXT816(0x8888888888888889);
  uVar1 = (dest->super_basic_buffer<char>).capacity_;
  uVar4 = (dest->super_basic_buffer<char>).size_ + 1;
  uVar5 = (int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f);
  if ((int)uVar5 < 0) {
    if (uVar1 < uVar4) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    }
    sVar2 = (dest->super_basic_buffer<char>).size_;
    (dest->super_basic_buffer<char>).size_ = sVar2 + 1;
    (dest->super_basic_buffer<char>).ptr_[sVar2] = '-';
    uVar5 = -uVar5;
  }
  else {
    if (uVar1 < uVar4) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    }
    sVar2 = (dest->super_basic_buffer<char>).size_;
    (dest->super_basic_buffer<char>).size_ = sVar2 + 1;
    (dest->super_basic_buffer<char>).ptr_[sVar2] = '+';
  }
  fmt_helper::pad2<500ul>(uVar5 / 0x3c,dest);
  if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
    (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
  }
  sVar2 = (dest->super_basic_buffer<char>).size_;
  (dest->super_basic_buffer<char>).size_ = sVar2 + 1;
  (dest->super_basic_buffer<char>).ptr_[sVar2] = ':';
  fmt_helper::pad2<500ul>(uVar5 % 0x3c,dest);
  scoped_pad::~scoped_pad(&local_40);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 6;
        scoped_pad p(field_size, padinfo_, dest);

#ifdef _WIN32
        int total_minutes = get_cached_offset(msg, tm_time);
#else
        // No need to chache under gcc,
        // it is very fast (already stored in tm.tm_gmtoff)
        (void)(msg);
        int total_minutes = os::utc_minutes_offset(tm_time);
#endif
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }